

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_exp_param_t * vrna_exp_params_comparative(uint n_seq,vrna_md_t *md)

{
  undefined1 local_808 [8];
  vrna_md_t md_1;
  vrna_md_t *md_local;
  vrna_exp_param_t *pvStack_10;
  uint n_seq_local;
  
  md_1.pair[0x14]._76_8_ = md;
  if (md == (vrna_md_t *)0x0) {
    vrna_md_set_default((vrna_md_t *)local_808);
    pvStack_10 = get_exp_params_ali((vrna_md_t *)local_808,n_seq,-1.0);
  }
  else {
    pvStack_10 = get_exp_params_ali(md,n_seq,-1.0);
  }
  return pvStack_10;
}

Assistant:

PUBLIC vrna_exp_param_t *
vrna_exp_params_comparative(unsigned int  n_seq,
                            vrna_md_t     *md)
{
  if (md) {
    return get_exp_params_ali(md, n_seq, -1.);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_exp_params_ali(&md, n_seq, -1.);
  }
}